

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg4.c
# Opt level: O1

int32_t borg_power_home(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  wchar_t wVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  ushort uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  ushort uVar15;
  int iVar16;
  bool bVar17;
  
  if (num_LIGHT == 1) {
    iVar3 = 0x96;
  }
  else if (num_LIGHT == 2) {
    iVar3 = 0xaa;
  }
  else {
    iVar3 = 0;
    if (2 < num_LIGHT) {
      iVar3 = num_LIGHT * 5 + 0xa0;
    }
  }
  if (num_slow_digest == 2) {
    iVar3 = iVar3 + 0x46;
  }
  else if (num_slow_digest == 1) {
    iVar3 = iVar3 + 0x32;
  }
  else if (2 < num_slow_digest) {
    iVar3 = iVar3 + num_slow_digest * 5 + 0x3c;
  }
  if (num_regenerate == 2) {
    iVar3 = iVar3 + 100;
  }
  else if (num_regenerate == 1) {
    iVar3 = iVar3 + 0x4b;
  }
  else if (2 < num_regenerate) {
    iVar3 = iVar3 + num_regenerate * 10 + 0x50;
  }
  if (num_telepathy == 2) {
    iVar3 = iVar3 + 0x5dc;
  }
  else if (num_telepathy == 1) {
    iVar3 = iVar3 + 1000;
  }
  else if (2 < num_telepathy) {
    iVar3 = iVar3 + num_telepathy * 10 + 0x5c8;
  }
  if (num_see_inv == 2) {
    iVar3 = iVar3 + 0x4b0;
  }
  else if (num_see_inv == 1) {
    iVar3 = iVar3 + 800;
  }
  else if (2 < num_see_inv) {
    iVar3 = iVar3 + num_see_inv * 10 + 0x49c;
  }
  if (num_ffall == 2) {
    iVar3 = iVar3 + 0xf;
  }
  else if (num_ffall == 1) {
    iVar3 = iVar3 + 10;
  }
  else if (2 < num_ffall) {
    iVar3 = iVar3 + (uint)(ushort)num_ffall + 0xd;
  }
  if (num_free_act == 2) {
    iVar3 = iVar3 + 0x5dc;
  }
  else if (num_free_act == 1) {
    iVar3 = iVar3 + 1000;
  }
  else if (2 < num_free_act) {
    iVar3 = iVar3 + num_free_act * 10 + 0x5c8;
  }
  if (num_hold_life == 2) {
    iVar3 = iVar3 + 0x5dc;
  }
  else if (num_hold_life == 1) {
    iVar3 = iVar3 + 1000;
  }
  else if (2 < num_hold_life) {
    iVar3 = iVar3 + num_hold_life * 10 + 0x5c8;
  }
  if (num_resist_acid == 2) {
    iVar3 = iVar3 + 0x5dc;
  }
  else if (num_resist_acid == 1) {
    iVar3 = iVar3 + 1000;
  }
  else if (2 < num_resist_acid) {
    iVar3 = iVar3 + (uint)(ushort)num_resist_acid + 0x5da;
  }
  if (num_immune_acid == 2) {
    iVar3 = iVar3 + 5000;
  }
  else if (num_immune_acid == 1) {
    iVar3 = iVar3 + 3000;
  }
  else if (2 < num_immune_acid) {
    iVar3 = iVar3 + num_immune_acid * 0x1e + 0x134c;
  }
  if (num_resist_elec == 2) {
    iVar3 = iVar3 + 0x5dc;
  }
  else if (num_resist_elec == 1) {
    iVar3 = iVar3 + 1000;
  }
  else if (2 < num_resist_elec) {
    iVar3 = iVar3 + (uint)(ushort)num_resist_elec + 0x5da;
  }
  if (num_immune_elec == 2) {
    iVar3 = iVar3 + 5000;
  }
  else if (num_immune_elec == 1) {
    iVar3 = iVar3 + 3000;
  }
  else if (2 < num_immune_elec) {
    iVar3 = iVar3 + num_immune_elec * 0x1e + 0x134c;
  }
  if (num_resist_fire == 2) {
    iVar3 = iVar3 + 0x5dc;
  }
  else if (num_resist_fire == 1) {
    iVar3 = iVar3 + 1000;
  }
  else if (2 < num_resist_fire) {
    iVar3 = iVar3 + (uint)(ushort)num_resist_fire + 0x5da;
  }
  if (num_immune_fire == 2) {
    iVar3 = iVar3 + 5000;
  }
  else if (num_immune_fire == 1) {
    iVar3 = iVar3 + 3000;
  }
  else if (2 < num_immune_fire) {
    iVar3 = iVar3 + num_immune_fire * 0x1e + 0x134c;
  }
  if (num_resist_cold == 2) {
    iVar3 = iVar3 + 0x5dc;
  }
  else if (num_resist_cold == 1) {
    iVar3 = iVar3 + 1000;
  }
  else if (2 < num_resist_cold) {
    iVar3 = iVar3 + (uint)(ushort)num_resist_cold + 0x5da;
  }
  if (num_immune_cold == 2) {
    iVar3 = iVar3 + 5000;
  }
  else if (num_immune_cold == 1) {
    iVar3 = iVar3 + 3000;
  }
  else if (2 < num_immune_cold) {
    iVar3 = iVar3 + num_immune_cold * 0x1e + 0x134c;
  }
  if (num_resist_pois == 2) {
    iVar3 = iVar3 + 9000;
  }
  else if (num_resist_pois == 1) {
    iVar3 = iVar3 + 5000;
  }
  else if (2 < num_resist_pois) {
    iVar3 = iVar3 + num_resist_pois * 0x28 + 0x22d8;
  }
  if (num_resist_conf == 2) {
    iVar3 = iVar3 + 8000;
  }
  else if (num_resist_conf == 1) {
    iVar3 = iVar3 + 2000;
  }
  else if (2 < num_resist_conf) {
    iVar3 = iVar3 + num_resist_conf * 0x2d + 0x1ee6;
  }
  if (num_resist_sound == 2) {
    iVar3 = iVar3 + 700;
  }
  else if (num_resist_sound == 1) {
    iVar3 = iVar3 + 500;
  }
  else if (2 < num_resist_sound) {
    iVar3 = iVar3 + num_resist_sound * 0x1e + 0x280;
  }
  if (num_resist_LIGHT == 2) {
    iVar3 = iVar3 + 0x96;
  }
  else if (num_resist_LIGHT == 1) {
    iVar3 = iVar3 + 100;
  }
  else if (2 < num_resist_LIGHT) {
    iVar3 = iVar3 + (uint)(ushort)num_resist_LIGHT + 0x94;
  }
  if (num_resist_dark == 2) {
    iVar3 = iVar3 + 0x96;
  }
  else if (num_resist_dark == 1) {
    iVar3 = iVar3 + 100;
  }
  else if (2 < num_resist_dark) {
    iVar3 = iVar3 + (uint)(ushort)num_resist_dark + 0x94;
  }
  if (num_resist_chaos == 2) {
    iVar3 = iVar3 + 0x5dc;
  }
  else if (num_resist_chaos == 1) {
    iVar3 = iVar3 + 1000;
  }
  else if (2 < num_resist_chaos) {
    iVar3 = iVar3 + num_resist_chaos * 10 + 0x5c8;
  }
  if (num_resist_disen == 2) {
    iVar3 = iVar3 + 7000;
  }
  else if (num_resist_disen == 1) {
    iVar3 = iVar3 + 5000;
  }
  else if (2 < num_resist_disen) {
    iVar3 = iVar3 + num_resist_disen * 0x23 + 0x1b12;
  }
  if (num_resist_shard == 2) {
    iVar3 = iVar3 + 0x96;
  }
  else if (num_resist_shard == 1) {
    iVar3 = iVar3 + 100;
  }
  else if (2 < num_resist_shard) {
    iVar3 = iVar3 + (uint)(ushort)num_resist_shard + 0x94;
  }
  if (num_resist_nexus == 2) {
    iVar3 = iVar3 + 300;
  }
  else if (num_resist_nexus == 1) {
    iVar3 = iVar3 + 200;
  }
  else if (2 < num_resist_nexus) {
    iVar3 = iVar3 + num_resist_nexus * 2 + 0x128;
  }
  if (num_resist_blind == 2) {
    iVar3 = iVar3 + 1000;
  }
  else if (num_resist_blind == 1) {
    iVar3 = iVar3 + 500;
  }
  else if (2 < num_resist_blind) {
    iVar3 = iVar3 + num_resist_blind * 5 + 0x3de;
  }
  if (num_resist_neth == 2) {
    iVar3 = iVar3 + 4000;
  }
  else if (num_resist_neth == 1) {
    iVar3 = iVar3 + 3000;
  }
  else if (2 < num_resist_neth) {
    iVar3 = iVar3 + num_resist_neth * 0x2d + 0xf46;
  }
  if (home_stat_add[0] < 9) {
    iVar3 = home_stat_add[0] * 300 + iVar3;
  }
  else if (home_stat_add[0] < 0xf) {
    iVar3 = (short)(home_stat_add[0] + -9) * 200 + iVar3 + 0xa8c;
  }
  else {
    iVar3 = (uint)(ushort)home_stat_add[0] + iVar3 + 0xf2d;
  }
  if (home_stat_add[3] < 9) {
    iVar3 = home_stat_add[3] * 300 + iVar3;
  }
  else if (home_stat_add[3] < 0xf) {
    iVar3 = (short)(home_stat_add[3] + -9) * 200 + iVar3 + 0xa8c;
  }
  else {
    iVar3 = (uint)(ushort)home_stat_add[3] + iVar3 + 0xf2d;
  }
  if (home_stat_add[4] < 0xf) {
    iVar3 = home_stat_add[4] * 300 + iVar3;
  }
  else if (home_stat_add[4] < 0x15) {
    iVar3 = iVar3 + (short)(home_stat_add[4] + -0xf) * 200 + 0x1194;
  }
  else {
    iVar3 = (uint)(ushort)home_stat_add[4] + iVar3 + 0x162f;
  }
  wVar4 = borg_spell_stat();
  if (L'\xffffffff' < wVar4) {
    iVar5 = (int)home_stat_add[(uint)wVar4];
    if (iVar5 < 0x14) {
      iVar3 = iVar3 + iVar5 * 400;
    }
    else if (home_stat_add[(uint)wVar4] < 0x1a) {
      iVar3 = iVar3 + iVar5 * 300 + 2000;
    }
    else {
      iVar3 = iVar3 + iVar5 * 5 + 0xe56;
    }
  }
  if (num_sustain_str == 2) {
    iVar3 = iVar3 + 0xfa;
  }
  else if (num_sustain_str == 1) {
    iVar3 = iVar3 + 200;
  }
  else if (2 < num_sustain_str) {
    iVar3 = iVar3 + (uint)(ushort)num_sustain_str + 0xf8;
  }
  if (num_sustain_int == 2) {
    iVar3 = iVar3 + 0xfa;
  }
  else if (num_sustain_int == 1) {
    iVar3 = iVar3 + 200;
  }
  else if (2 < num_sustain_int) {
    iVar3 = iVar3 + (uint)(ushort)num_sustain_int + 0xf8;
  }
  if (num_sustain_wis == 2) {
    iVar3 = iVar3 + 0xfa;
  }
  else if (num_sustain_wis == 1) {
    iVar3 = iVar3 + 200;
  }
  else if (2 < num_sustain_wis) {
    iVar3 = iVar3 + (uint)(ushort)num_sustain_wis + 0xf8;
  }
  if (num_sustain_con == 2) {
    iVar3 = iVar3 + 0xfa;
  }
  else if (num_sustain_con == 1) {
    iVar3 = iVar3 + 200;
  }
  else if (2 < num_sustain_con) {
    iVar3 = iVar3 + (uint)(ushort)num_sustain_con + 0xf8;
  }
  if (num_sustain_dex == 2) {
    iVar3 = iVar3 + 0xfa;
  }
  else if (num_sustain_dex == 1) {
    iVar3 = iVar3 + 200;
  }
  else if (2 < num_sustain_dex) {
    iVar3 = iVar3 + (uint)(ushort)num_sustain_dex + 0xf8;
  }
  if (num_sustain_all == 2) {
    iVar3 = iVar3 + 0x5dc;
  }
  else if (num_sustain_all == 1) {
    iVar3 = iVar3 + 1000;
  }
  else if (2 < num_sustain_all) {
    iVar3 = iVar3 + (uint)(ushort)num_sustain_all + 0x5da;
  }
  iVar5 = (int)num_weapons;
  if (iVar5 < 6) {
    if (1 < num_weapons) {
      iVar3 = iVar3 + iVar5 * -100 + 100;
    }
  }
  else {
    iVar3 = iVar3 + iVar5 * -2000 + 10000;
  }
  iVar5 = 0;
  if (2 < num_bow) {
    iVar5 = num_bow * -1000 + 2000;
  }
  iVar5 = iVar5 + iVar3;
  iVar3 = (int)num_rings;
  if (iVar3 < 7) {
    if (4 < num_rings) {
      iVar5 = iVar5 + iVar3 * -2000 + 8000;
    }
  }
  else {
    iVar5 = iVar5 + iVar3 * -4000 + 24000;
  }
  iVar3 = borg_skill[0x18];
  iVar12 = 0;
  if (iVar3 < 10) {
    iVar8 = (int)num_food;
    if (kb_info[0x1c].max_stack < (int)num_food) {
      iVar8 = kb_info[0x1c].max_stack;
    }
    iVar12 = 0;
    if (0 < iVar8) {
      iVar12 = iVar8 * 0x1f36 + ((iVar8 + -2) * (iVar8 + -1) & 0xfffffffeU) * -5 + 10;
    }
  }
  iVar8 = kb_info[0x19].max_stack;
  iVar1 = (int)num_ident;
  if (iVar8 < num_ident) {
    iVar1 = iVar8;
  }
  if (0 < iVar1) {
    iVar12 = iVar12 + iVar1 * 0x7c6 + ((iVar1 + -2) * (iVar1 + -1) & 0xfffffffeU) * -5 + 10;
  }
  iVar1 = borg_skill[0x17];
  if (iVar1 < 0x2d) {
    iVar14 = (int)num_enchant_to_a;
    if (iVar8 < num_enchant_to_a) {
      iVar14 = iVar8;
    }
    if (0 < iVar14) {
      iVar12 = iVar12 + iVar14 * 0x1ea + ((iVar14 + -2) * (iVar14 + -1) & 0xfffffffeU) * -5 + 10;
    }
  }
  if (iVar1 < 0x2d) {
    iVar14 = (int)num_enchant_to_h;
    if (iVar8 < num_enchant_to_h) {
      iVar14 = iVar8;
    }
    if (0 < iVar14) {
      iVar12 = iVar12 + iVar14 * 0x1ea + ((iVar14 + -2) * (iVar14 + -1) & 0xfffffffeU) * -5 + 10;
    }
  }
  if (iVar1 < 0x2d) {
    iVar14 = (int)num_enchant_to_d;
    if (iVar8 < num_enchant_to_d) {
      iVar14 = iVar8;
    }
    if (0 < iVar14) {
      iVar12 = iVar12 + iVar14 * 0x1ea + ((iVar14 + -2) * (iVar14 + -1) & 0xfffffffeU) * -5 + 10;
    }
  }
  iVar14 = (int)num_pfe;
  if (iVar8 < num_pfe) {
    iVar14 = iVar8;
  }
  if (0 < iVar14) {
    iVar12 = iVar12 + iVar14 * 0x1ea + ((iVar14 + -2) * (iVar14 + -1) & 0xfffffffeU) * -5 + 10;
  }
  iVar14 = (int)num_glyph;
  if (iVar8 < num_glyph) {
    iVar14 = iVar8;
  }
  if (0 < iVar14) {
    iVar12 = iVar12 + iVar14 * 0x1ea + ((iVar14 + -2) * (iVar14 + -1) & 0xfffffffeU) * -5 + 10;
  }
  iVar16 = iVar8 * 2;
  iVar14 = (int)num_genocide;
  if (iVar16 < num_genocide) {
    iVar14 = iVar16;
  }
  if (0 < iVar14) {
    iVar12 = iVar12 + iVar14 * 0x1ea + ((iVar14 + -2) * (iVar14 + -1) & 0xfffffffeU) * -5 + 10;
  }
  iVar14 = (int)num_mass_genocide;
  if (iVar16 < num_mass_genocide) {
    iVar14 = iVar16;
  }
  iVar16 = 0;
  if (0 < iVar14) {
    iVar16 = iVar14 * 500;
  }
  iVar16 = iVar16 + iVar12;
  iVar12 = (int)num_recharge;
  if (iVar8 < num_recharge) {
    iVar12 = iVar8;
  }
  if (0 < iVar12) {
    iVar16 = iVar12 * 0x1ea + iVar16 + ((iVar12 + -2) * (iVar12 + -1) & 0xfffffffeU) * -5 + 10;
  }
  if ((borg_class == L'\0') && (borg_skill[0x5f] - 0x15U < 0x3b)) {
    uVar7 = kb_info[0x1a].max_stack;
    uVar6 = (int)num_pot_rheat;
    if ((int)uVar7 < (int)num_pot_rheat) {
      uVar6 = uVar7;
    }
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    else {
      iVar16 = iVar16 + uVar6 * 0x5a + ((uVar6 - 2) * (uVar6 - 1) & 0xfffffffe) * -5 + 10;
    }
    uVar13 = (int)num_pot_rcold;
    if ((int)uVar7 < (int)num_pot_rcold) {
      uVar13 = uVar7;
    }
    if (uVar13 - uVar6 != 0 && (int)uVar6 <= (int)uVar13) {
      iVar16 = iVar16 + uVar6 * -10 + (uVar6 * -10 + 0x5a) * (uVar13 + ~uVar6) +
               (((uVar13 - uVar6) + -2) * (uVar13 + ~uVar6) & 0xfffffffe) * -5 + 100;
    }
  }
  if (0 < num_recall) {
    uVar11 = 4;
    if ((ushort)(num_recall - 1U) < 4) {
      uVar11 = num_recall - 1U;
    }
    iVar16 = iVar16 + (uint)(ushort)(uVar11 * 100) + 100;
  }
  if ((iVar3 < 0x28) && (0 < num_escape)) {
    uVar11 = 0x54;
    if ((ushort)(num_escape - 1U) < 0x54) {
      uVar11 = num_escape - 1U;
    }
    uVar7 = (uint)uVar11;
    iVar16 = iVar16 + uVar7 * 0x7c6 + ((uVar7 - 1) * uVar7 & 0xfffffffe) * -5 + 2000;
  }
  iVar12 = (int)num_tele_staves;
  if (kb_info[0x16].max_stack < (int)num_tele_staves) {
    iVar12 = kb_info[0x16].max_stack;
  }
  iVar14 = 0;
  if (0 < iVar12) {
    iVar14 = iVar12 * -50000;
  }
  iVar14 = iVar14 + iVar16;
  if (0 < num_teleport) {
    uVar11 = 0x54;
    if ((ushort)(num_teleport - 1U) < 0x54) {
      uVar11 = num_teleport - 1U;
    }
    iVar14 = (uint)uVar11 * 5000 + 5000 + iVar14;
  }
  if (iVar3 < 10) {
    iVar3 = (int)num_phase;
    if (iVar8 < num_phase) {
      iVar3 = iVar8;
    }
    if (0 < iVar3) {
      iVar14 = iVar3 * 5000 + iVar14;
    }
  }
  if (1 < borg_skill[0x13]) {
    iVar3 = (int)num_mana;
    if (kb_info[0x1a].max_stack < (int)num_mana) {
      iVar3 = kb_info[0x1a].max_stack;
    }
    if (0 < iVar3) {
      iVar14 = ((iVar14 + iVar3 * 0x1768) - ((iVar3 * 4 + -8) * (iVar3 + 0x3fffffff) & 0xfffffff8U))
               + 8;
    }
  }
  if ((iVar1 == 1) && (0 < num_heal)) {
    uVar11 = 9;
    if ((ushort)(num_heal - 1U) < 9) {
      uVar11 = num_heal - 1U;
    }
    iVar14 = iVar14 + (uint)uVar11 * -5000 + -5000;
  }
  iVar3 = (int)num_cure_critical;
  if (kb_info[0x1a].max_stack < (int)num_cure_critical) {
    iVar3 = kb_info[0x1a].max_stack;
  }
  if (0 < iVar3) {
    iVar14 = iVar14 + iVar3 * 0x5d2 + ((iVar3 + -2) * (iVar3 + -1) & 0xfffffffeU) * -5 + 10;
  }
  if (0 < num_heal) {
    uVar11 = 0x59;
    if ((ushort)(num_heal - 1U) < 0x59) {
      uVar11 = num_heal - 1U;
    }
    iVar14 = iVar14 + (uint)uVar11 * 3000 + 3000;
  }
  if (0 < num_ezheal) {
    uVar11 = num_ezheal - 1;
    if (0xc4 < (ushort)(num_ezheal - 1U)) {
      uVar11 = 0xc5;
    }
    iVar14 = iVar14 + (uint)uVar11 * 8000 + 8000;
  }
  if (0 < num_life) {
    uVar11 = num_life - 1;
    if (0xc4 < (ushort)(num_life - 1U)) {
      uVar11 = 0xc5;
    }
    iVar14 = iVar14 + (uint)uVar11 * 9000 + 9000;
  }
  if ((0x23 < iVar1) && (0 < num_cure_serious)) {
    uVar11 = 0x59;
    if ((ushort)(num_cure_serious - 1U) < 0x59) {
      uVar11 = num_cure_serious - 1U;
    }
    uVar7 = (uint)uVar11;
    iVar14 = iVar14 + uVar7 * -0x5d2 + ((uVar7 - 1) * uVar7 >> 1) * 10 + -0x5dc;
  }
  iVar3 = iVar14 + -0x1d4c;
  if (num_fix_exp == 0) {
    iVar3 = iVar14;
  }
  if (iVar1 != 0x32) {
    iVar3 = iVar14;
  }
  if (iVar1 - 0x24U < 0xe) {
    if (num_fix_exp < 1) goto LAB_0020e125;
    bVar17 = (ushort)(num_fix_exp - 1U) < 0x45;
    uVar11 = 0x45;
  }
  else {
    if (0x23 < iVar1 || num_fix_exp < 1) goto LAB_0020e125;
    bVar17 = (ushort)(num_fix_exp - 1U) < 4;
    uVar11 = 4;
  }
  if (bVar17) {
    uVar11 = num_fix_exp - 1;
  }
  iVar3 = iVar3 + (uint)uVar11 * 0x3de + ((uVar11 - 1) * (uint)uVar11 & 0xfffffffe) * -5 + 1000;
LAB_0020e125:
  lVar10 = 0;
  do {
    if (iVar1 < 0xf) {
      uVar11 = num_book[lVar10];
      uVar15 = uVar11;
      if ((short)uVar11 < 1) {
        uVar15 = 0;
      }
      iVar12 = 5000;
      do {
        if ((uint)uVar15 * 10 + iVar12 == 5000) break;
        iVar8 = iVar12;
        if (uVar11 == 0) {
          iVar8 = 0;
        }
        iVar3 = iVar3 + iVar8;
        iVar12 = iVar12 + -10;
      } while (iVar12 != 0x1356);
    }
    lVar10 = lVar10 + 1;
    if (lVar10 == 4) {
      iVar3 = num_ego * 5000 + num_artifact * 500 + iVar3;
      if (home_un_id != 0) {
        iVar3 = iVar3 + ((int)home_un_id - borg_skill[0xc2]) * 0x3ed;
      }
      iVar8 = (uint)(ushort)num_neck * -0x5dc + 0x1194;
      iVar12 = 0;
      if (num_neck < 4) {
        iVar8 = 0;
      }
      iVar1 = (uint)(ushort)num_armor * -1000 + 6000;
      if (num_armor < 7) {
        iVar1 = iVar12;
      }
      iVar14 = (uint)(ushort)num_cloaks * -1000 + 3000;
      if (num_cloaks < 4) {
        iVar14 = 0;
      }
      iVar16 = (uint)(ushort)num_shields * -1000 + 3000;
      if (num_shields < 4) {
        iVar16 = iVar12;
      }
      iVar9 = (uint)(ushort)num_hats * -1000 + 4000;
      if (num_hats < 5) {
        iVar9 = 0;
      }
      iVar2 = (uint)(ushort)num_gloves * -1000 + 3000;
      if (num_gloves < 4) {
        iVar2 = iVar12;
      }
      iVar12 = (uint)(ushort)num_boots * -1000 + 3000;
      if (num_boots < 4) {
        iVar12 = 0;
      }
      return ((int)num_bad_gloves + (int)num_edged_weapon) * -3000 +
             num_duplicate_items * -50000 + iVar12 + iVar2 +
             iVar9 + iVar16 + iVar14 + iVar1 + iVar8 + iVar5 + (int)home_damage + iVar3;
    }
  } while( true );
}

Assistant:

static int32_t borg_power_home_aux1(void)
{
    int32_t value = 0L;

    /* This would be better seperated by item type (so 1 bonus for resist cold
     * armor */
    /*   1 bonus for resist cold shield... but that would take a bunch more
     * code. */

    /* try to collect at least 2 of each resist/power (for swapping) */
    /* This can be used to get rid of extra artifacts... */

    /* spare lite sources.  Artifacts only */
    if (num_LIGHT == 1)
        value += 150L;
    else if (num_LIGHT == 2)
        value += 170L;
    else if (num_LIGHT > 2)
        value += 170L + (num_LIGHT - 2) * 5L;

    if (num_slow_digest == 1)
        value += 50L;
    else if (num_slow_digest == 2)
        value += 70L;
    else if (num_slow_digest > 2)
        value += 70L + (num_slow_digest - 2) * 5L;

    if (num_regenerate == 1)
        value += 75L;
    else if (num_regenerate == 2)
        value += 100L;
    else if (num_regenerate > 2)
        value += 100L + (num_regenerate - 2) * 10L;

    if (num_telepathy == 1)
        value += 1000L;
    else if (num_telepathy == 2)
        value += 1500L;
    else if (num_telepathy > 2)
        value += 1500L + (num_telepathy - 2) * 10L;

    if (num_see_inv == 1)
        value += 800L;
    else if (num_see_inv == 2)
        value += 1200L;
    else if (num_see_inv > 2)
        value += 1200L + (num_see_inv - 2) * 10L;

    if (num_ffall == 1)
        value += 10L;
    else if (num_ffall == 2)
        value += 15L;
    else if (num_ffall > 2)
        value += 15L + (num_ffall - 2) * 1L;

    if (num_free_act == 1)
        value += 1000L;
    else if (num_free_act == 2)
        value += 1500L;
    else if (num_free_act > 2)
        value += 1500L + (num_free_act - 2) * 10L;

    if (num_hold_life == 1)
        value += 1000L;
    else if (num_hold_life == 2)
        value += 1500L;
    else if (num_hold_life > 2)
        value += 1500L + (num_hold_life - 2) * 10L;

    if (num_resist_acid == 1)
        value += 1000L;
    else if (num_resist_acid == 2)
        value += 1500L;
    else if (num_resist_acid > 2)
        value += 1500L + (num_resist_acid - 2) * 1L;
    if (num_immune_acid == 1)
        value += 3000L;
    else if (num_immune_acid == 2)
        value += 5000L;
    else if (num_immune_acid > 2)
        value += 5000L + (num_immune_acid - 2) * 30L;

    if (num_resist_elec == 1)
        value += 1000L;
    else if (num_resist_elec == 2)
        value += 1500L;
    else if (num_resist_elec > 2)
        value += 1500L + (num_resist_elec - 2) * 1L;
    if (num_immune_elec == 1)
        value += 3000L;
    else if (num_immune_elec == 2)
        value += 5000L;
    else if (num_immune_elec > 2)
        value += 5000L + (num_immune_elec - 2) * 30L;

    if (num_resist_fire == 1)
        value += 1000L;
    else if (num_resist_fire == 2)
        value += 1500L;
    else if (num_resist_fire > 2)
        value += 1500L + (num_resist_fire - 2) * 1L;
    if (num_immune_fire == 1)
        value += 3000L;
    else if (num_immune_fire == 2)
        value += 5000L;
    else if (num_immune_fire > 2)
        value += 5000L + (num_immune_fire - 2) * 30L;

    if (num_resist_cold == 1)
        value += 1000L;
    else if (num_resist_cold == 2)
        value += 1500L;
    else if (num_resist_cold > 2)
        value += 1500L + (num_resist_cold - 2) * 1L;
    if (num_immune_cold == 1)
        value += 3000L;
    else if (num_immune_cold == 2)
        value += 5000L;
    else if (num_immune_cold > 2)
        value += 5000L + (num_immune_cold - 2) * 30L;

    if (num_resist_pois == 1)
        value += 5000L;
    else if (num_resist_pois == 2)
        value += 9000L;
    else if (num_resist_pois > 2)
        value += 9000L + (num_resist_pois - 2) * 40L;

    if (num_resist_conf == 1)
        value += 2000L;
    else if (num_resist_conf == 2)
        value += 8000L;
    else if (num_resist_conf > 2)
        value += 8000L + (num_resist_conf - 2) * 45L;

    if (num_resist_sound == 1)
        value += 500L;
    else if (num_resist_sound == 2)
        value += 700L;
    else if (num_resist_sound > 2)
        value += 700L + (num_resist_sound - 2) * 30L;

    if (num_resist_LIGHT == 1)
        value += 100L;
    else if (num_resist_LIGHT == 2)
        value += 150L;
    else if (num_resist_LIGHT > 2)
        value += 150L + (num_resist_LIGHT - 2) * 1L;

    if (num_resist_dark == 1)
        value += 100L;
    else if (num_resist_dark == 2)
        value += 150L;
    else if (num_resist_dark > 2)
        value += 150L + (num_resist_dark - 2) * 1L;

    if (num_resist_chaos == 1)
        value += 1000L;
    else if (num_resist_chaos == 2)
        value += 1500L;
    else if (num_resist_chaos > 2)
        value += 1500L + (num_resist_chaos - 2) * 10L;

    if (num_resist_disen == 1)
        value += 5000L;
    else if (num_resist_disen == 2)
        value += 7000L;
    else if (num_resist_disen > 2)
        value += 7000L + (num_resist_disen - 2) * 35L;

    if (num_resist_shard == 1)
        value += 100L;
    else if (num_resist_shard == 2)
        value += 150L;
    else if (num_resist_shard > 2)
        value += 150L + (num_resist_shard - 2) * 1L;

    if (num_resist_nexus == 1)
        value += 200L;
    else if (num_resist_nexus == 2)
        value += 300L;
    else if (num_resist_nexus > 2)
        value += 300L + (num_resist_nexus - 2) * 2L;

    if (num_resist_blind == 1)
        value += 500L;
    else if (num_resist_blind == 2)
        value += 1000L;
    else if (num_resist_blind > 2)
        value += 1000L + (num_resist_blind - 2) * 5L;

    if (num_resist_neth == 1)
        value += 3000L;
    else if (num_resist_neth == 2)
        value += 4000L;
    else if (num_resist_neth > 2)
        value += 4000L + (num_resist_neth - 2) * 45L;

    /* stat gain items as well...(good to carry ring of dex +6 in */
    /*                            house even if I don't need it right now) */
    if (home_stat_add[STAT_STR] < 9)
        value += home_stat_add[STAT_STR] * 300L;
    else if (home_stat_add[STAT_STR] < 15)
        value += 9 * 300L + (home_stat_add[STAT_STR] - 9) * 200L;
    else
        value += 9 * 300L + 6 * 200L + (home_stat_add[STAT_STR] - 15) * 1L;

    if (home_stat_add[STAT_DEX] < 9)
        value += home_stat_add[STAT_DEX] * 300L;
    else if (home_stat_add[STAT_DEX] < 15)
        value += 9 * 300L + (home_stat_add[STAT_DEX] - 9) * 200L;
    else
        value += 9 * 300L + 6 * 200L + (home_stat_add[STAT_DEX] - 15) * 1L;

    /* HACK extra con for thorin and other such things */
    if (home_stat_add[STAT_CON] < 15)
        value += home_stat_add[STAT_CON] * 300L;
    else if (home_stat_add[STAT_CON] < 21)
        value += 15 * 300L + (home_stat_add[STAT_CON] - 15) * 200L;
    else
        value += 15 * 300L + 6 * 200L + (home_stat_add[STAT_CON] - 21) * 1L;

    /* spell stat is only bonused for spell casters. */
    int spell_stat = borg_spell_stat();
    if (spell_stat >= 0) {
        if (home_stat_add[spell_stat] < 20)
            value += home_stat_add[spell_stat] * 400L;
        else if (home_stat_add[spell_stat] < 26)
            value += 20 * 400L + (home_stat_add[spell_stat] - 20) * 300L;
        else
            value
                += 20 * 100L + 6 * 300L + (home_stat_add[spell_stat] - 26) * 5L;
    }

    /* Sustains */
    if (num_sustain_str == 1)
        value += 200L;
    else if (num_sustain_str == 2)
        value += 250L;
    else if (num_sustain_str > 2)
        value += 250L + (num_sustain_str - 2) * 1L;

    if (num_sustain_int == 1)
        value += 200L;
    else if (num_sustain_int == 2)
        value += 250L;
    else if (num_sustain_int > 2)
        value += 250L + (num_sustain_int - 2) * 1L;

    if (num_sustain_wis == 1)
        value += 200L;
    else if (num_sustain_wis == 2)
        value += 250L;
    else if (num_sustain_wis > 2)
        value += 250L + (num_sustain_wis - 2) * 1L;

    if (num_sustain_con == 1)
        value += 200L;
    else if (num_sustain_con == 2)
        value += 250L;
    else if (num_sustain_con > 2)
        value += 250L + (num_sustain_con - 2) * 1L;

    if (num_sustain_dex == 1)
        value += 200L;
    else if (num_sustain_dex == 2)
        value += 250L;
    else if (num_sustain_dex > 2)
        value += 250L + (num_sustain_dex - 2) * 1L;

    if (num_sustain_all == 1)
        value += 1000L;
    else if (num_sustain_all == 2)
        value += 1500L;
    else if (num_sustain_all > 2)
        value += 1500L + (num_sustain_all - 2) * 1L;

    /* do a minus for too many duplicates.  This way we do not store */
    /* useless items and spread out types of items. */
    if (num_weapons > 5)
        value -= (num_weapons - 5) * 2000L;
    else if (num_weapons > 1)
        value -= (num_weapons - 1) * 100L;
    if (num_bow > 2)
        value -= (num_bow - 2) * 1000L;
    if (num_rings > 6)
        value -= (num_rings - 6) * 4000L;
    else if (num_rings > 4)
        value -= (num_rings - 4) * 2000L;
    if (num_neck > 3)
        value -= (num_neck - 3) * 1500L;
    else if (num_neck > 3)
        value -= (num_neck - 3) * 700L;
    if (num_armor > 6)
        value -= (num_armor - 6) * 1000L;
    if (num_cloaks > 3)
        value -= (num_cloaks - 3) * 1000L;
    if (num_shields > 3)
        value -= (num_shields - 3) * 1000L;
    if (num_hats > 4)
        value -= (num_hats - 4) * 1000L;
    if (num_gloves > 3)
        value -= (num_gloves - 3) * 1000L;
    if (num_boots > 3)
        value -= (num_boots - 3) * 1000L;

    value += home_damage;

    /* if edged and priest, dump it   */
    value -= num_edged_weapon * 3000L;

    /* if gloves and mage or ranger and not FA/Dex, dump it. */
    value -= num_bad_gloves * 3000L;

    /* do not allow duplication of items. */
    value -= num_duplicate_items * 50000L;

    /* Return the value */
    return (value);
}